

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O0

integer_t * __thiscall tchecker::vm_t::slot_of(vm_t *this,bytecode_t id)

{
  bool bVar1;
  pointer pmVar2;
  pointer ppVar3;
  out_of_range *this_00;
  _Self local_38;
  _Self local_30;
  iterator kv;
  reverse_iterator it;
  bytecode_t id_local;
  vm_t *this_local;
  
  it.current._M_current =
       (__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>
        )(__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>
          )id;
  std::
  vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
  ::rbegin((vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
            *)&stack0xffffffffffffffe0);
  while( true ) {
    std::
    vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
    ::rend((vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
            *)&kv);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
                             *)&stack0xffffffffffffffe0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
                             *)&kv);
    if (!bVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"unknown local variable ID");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    pmVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
                           *)&stack0xffffffffffffffe0);
    local_30._M_node =
         (_Base_ptr)
         std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>::find
                   (pmVar2,(key_type_conflict *)&it);
    pmVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
                           *)&stack0xffffffffffffffe0);
    local_38._M_node =
         (_Base_ptr)
         std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>::end
                   (pmVar2);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_*,_std::vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_long,_int>_>::operator->(&local_30);
  return &ppVar3->second;
}

Assistant:

tchecker::integer_t & slot_of(tchecker::bytecode_t id)
  {
    for (auto it = _frames.rbegin(); it != _frames.rend(); ++it) {
      auto kv = it->find(id);
      if (kv != it->end())
        return kv->second;
    }
    throw std::out_of_range("unknown local variable ID");
  }